

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O2

bool __thiscall
llvm::StringMap<llvm::cl::Option_*,_llvm::MallocAllocator>::erase
          (StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *this,StringRef Key)

{
  iterator I;
  StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
  SVar1;
  
  I = find(this,Key);
  SVar1.Ptr = (this->super_StringMapImpl).TheTable + (this->super_StringMapImpl).NumBuckets;
  if (I.
      super_StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
      .Ptr != (StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
               )SVar1.Ptr) {
    erase(this,I);
  }
  return I.
         super_StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
         .Ptr != (StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
                  )SVar1.Ptr;
}

Assistant:

bool erase(StringRef Key) {
    iterator I = find(Key);
    if (I == end()) return false;
    erase(I);
    return true;
  }